

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

size_t bitset_minimum(bitset_t *bitset)

{
  unsigned_long_long input_num;
  int iVar1;
  long *in_RDI;
  uint64_t w;
  size_t k;
  ulong local_18;
  
  local_18 = 0;
  while( true ) {
    if ((ulong)in_RDI[1] <= local_18) {
      return 0xffffffffffffffff;
    }
    input_num = *(unsigned_long_long *)(*in_RDI + local_18 * 8);
    if (input_num != 0) break;
    local_18 = local_18 + 1;
  }
  iVar1 = roaring_trailing_zeroes(input_num);
  return (long)iVar1 + local_18 * 0x40;
}

Assistant:

size_t bitset_minimum(const bitset_t *bitset) {
    for (size_t k = 0; k < bitset->arraysize; k++) {
        uint64_t w = bitset->array[k];
        if (w != 0) {
            return roaring_trailing_zeroes(w) + k * 64;
        }
    }
    return SIZE_MAX;
}